

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmenu.cpp
# Opt level: O3

void __thiscall QMenuPrivate::hideUpToMenuBar(QMenuPrivate *this)

{
  QWidget *this_00;
  Data *pDVar1;
  int iVar2;
  QStyle *pQVar3;
  long lVar4;
  QMenu *menu;
  QObject *pQVar5;
  
  this_00 = *(QWidget **)&(this->super_QWidgetPrivate).field_0x8;
  pQVar3 = QWidget::style(this_00);
  iVar2 = (**(code **)(*(long *)pQVar3 + 0xf0))(pQVar3,0x52,0);
  if ((this->field_0x421 & 4) == 0) {
    pDVar1 = (this->causedPopup).widget.wp.d;
    if ((pDVar1 == (Data *)0x0) || (*(int *)(pDVar1 + 4) == 0)) {
      hideMenu(this,(QMenu *)this_00);
    }
    else {
      pQVar5 = (this->causedPopup).widget.wp.value;
      hideMenu(this,(QMenu *)this_00);
      while (pQVar5 != (QObject *)0x0) {
        lVar4 = QMetaObject::cast((QObject *)&QMenuBar::staticMetaObject);
        if (lVar4 != 0) {
          QMenuBarPrivate::setCurrentAction
                    (*(QMenuBarPrivate **)(lVar4 + 8),(QAction *)0x0,false,false);
          QMenuBarPrivate::setKeyboardMode(*(QMenuBarPrivate **)(lVar4 + 8),false);
          break;
        }
        menu = (QMenu *)QMetaObject::cast((QObject *)&QMenu::staticMetaObject);
        if (menu == (QMenu *)0x0) break;
        lVar4 = *(long *)&(menu->super_QWidget).field_0x8;
        if ((*(long *)(lVar4 + 0x2f8) == 0) || (*(int *)(*(long *)(lVar4 + 0x2f8) + 4) == 0)) {
          pQVar5 = (QObject *)0x0;
        }
        else {
          pQVar5 = *(QObject **)(lVar4 + 0x300);
        }
        if ((*(byte *)(lVar4 + 0x421) & 4) == 0) {
          hideMenu(this,menu);
        }
        if (iVar2 == 0) {
          setCurrentAction(*(QMenuPrivate **)&(menu->super_QWidget).field_0x8,(QAction *)0x0,-1,
                           SelectedFromElsewhere,false);
        }
      }
    }
  }
  setCurrentAction(this,(QAction *)0x0,-1,SelectedFromElsewhere,false);
  return;
}

Assistant:

void QMenuPrivate::hideUpToMenuBar()
{
    Q_Q(QMenu);
    bool fadeMenus = q->style()->styleHint(QStyle::SH_Menu_FadeOutOnHide, nullptr, q);
    if (!tornoff) {
        QWidget *caused = causedPopup.widget;
        hideMenu(q); //hide after getting causedPopup
        while(caused) {
#if QT_CONFIG(menubar)
            if (QMenuBar *mb = qobject_cast<QMenuBar*>(caused)) {
                mb->d_func()->setCurrentAction(nullptr);
                mb->d_func()->setKeyboardMode(false);
                caused = nullptr;
            } else
#endif
            if (QMenu *m = qobject_cast<QMenu*>(caused)) {
                caused = m->d_func()->causedPopup.widget;
                if (!m->d_func()->tornoff)
                    hideMenu(m);
                if (!fadeMenus) // Mac doesn't clear the action until after hidden.
                    m->d_func()->setCurrentAction(nullptr);
            } else {                caused = nullptr;
            }
        }
    }
    setCurrentAction(nullptr);
}